

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

msegmentptr segment_holding(mstate m,char *addr)

{
  msegmentptr sp;
  char *addr_local;
  mstate m_local;
  
  sp = &m->seg;
  while ((addr < sp->base || (sp->base + sp->size <= addr))) {
    sp = sp->next;
    if (sp == (malloc_segment *)0x0) {
      return (msegmentptr)0x0;
    }
  }
  return sp;
}

Assistant:

static msegmentptr segment_holding(mstate m, char *addr)
{
  msegmentptr sp = &m->seg;
  for (;;) {
    if (addr >= sp->base && addr < sp->base + sp->size)
      return sp;
    if ((sp = sp->next) == 0)
      return 0;
  }
}